

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgRuleLocalPolynomial.hpp
# Opt level: O1

void TasGrid::RuleLocal::van_matrix<(TasGrid::RuleLocal::erule)2>
               (int max_order,int num_rows,vector<int,_std::allocator<int>_> *pntr,
               vector<int,_std::allocator<int>_> *indx,vector<double,_std::allocator<double>_> *vals
               )

{
  pointer piVar1;
  pointer pdVar2;
  iterator iVar3;
  iterator iVar4;
  pointer piVar5;
  uint uVar6;
  pointer *ppiVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  value_type_conflict3 i;
  vector<double,_std::allocator<double>_> ancestors_vals;
  int local_b4;
  double *local_b0;
  int local_a4;
  vector<int,std::allocator<int>> *local_a0;
  vector<int,_std::allocator<int>_> local_98;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined1 local_70 [8];
  vector<double,_std::allocator<double>_> local_68;
  double local_50;
  double *local_48;
  ulong local_40;
  double local_38;
  
  iVar8 = num_rows;
  if ((1 < (uint)num_rows) && (iVar8 = 1, num_rows != 2)) {
    uVar6 = num_rows - 1;
    do {
      uVar6 = (int)uVar6 >> 1;
      iVar8 = iVar8 + 1;
    } while (1 < uVar6);
  }
  local_a0 = (vector<int,std::allocator<int>> *)pntr;
  if (num_rows == 2) {
    local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x1;
    local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)CONCAT44(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage._4_4_,2);
    ::std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
              ((vector<int,std::allocator<int>> *)indx,&local_98);
    local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)&DAT_3ff0000000000000;
    uStack_80 = 0x3ff0000000000000;
    local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)&DAT_3ff0000000000000;
    local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)&DAT_3ff0000000000000;
    local_78 = 0x3ff0000000000000;
    ::std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
              ((vector<double,std::allocator<double>> *)vals,&local_98,local_70);
    local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x500000003;
    ppiVar7 = &local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
  }
  else if (num_rows == 1) {
    local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)CONCAT44(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish._4_4_,1);
    ::std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
              ((vector<int,std::allocator<int>> *)indx,&local_98);
    local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)&DAT_3ff0000000000000;
    local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
    ._0_4_ = 0;
    local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
    ._4_4_ = 0x3ff00000;
    local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)&DAT_3ff0000000000000;
    ::std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
              ((vector<double,std::allocator<double>> *)vals,&local_98,&uStack_80);
    local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)CONCAT44(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish._4_4_,3);
    ppiVar7 = (pointer *)
              ((long)&local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 4);
  }
  else {
    if (num_rows != 0) {
      piVar1 = (indx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
               ._M_start;
      if ((indx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_finish != piVar1) {
        (indx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish = piVar1;
      }
      ::std::vector<int,_std::allocator<int>_>::reserve
                ((vector<int,_std::allocator<int>_> *)indx,(long)(iVar8 * num_rows));
      pdVar2 = (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish != pdVar2) {
        (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
        _M_finish = pdVar2;
      }
      ::std::vector<double,_std::allocator<double>_>::reserve
                ((vector<double,_std::allocator<double>_> *)vals,(long)(iVar8 * num_rows));
      local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)((ulong)local_68.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start._4_4_ << 0x20);
      local_40 = (ulong)(uint)num_rows;
      ::std::vector<int,_std::allocator<int>_>::vector
                (&local_98,(long)(num_rows + 1),(value_type_conflict3 *)&local_68,
                 (allocator_type *)&local_b0);
      ::std::vector<int,_std::allocator<int>_>::_M_move_assign
                ((vector<int,_std::allocator<int>_> *)local_a0,&local_98);
      if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      lVar10 = 0;
      do {
        local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)CONCAT44(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     *(int *)((long)&DAT_001d0890 + lVar10));
        iVar3._M_current =
             (indx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
        if (iVar3._M_current ==
            (indx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          ::std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)indx,iVar3,(int *)&local_98);
        }
        else {
          *iVar3._M_current = *(int *)((long)&DAT_001d0890 + lVar10);
          (indx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_finish = iVar3._M_current + 1;
        }
        lVar10 = lVar10 + 4;
      } while (lVar10 != 0x14);
      iVar9 = 5;
      do {
        local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)&DAT_3ff0000000000000;
        iVar4._M_current =
             (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (vals,iVar4,(double *)&local_98);
        }
        else {
          *iVar4._M_current = 1.0;
          (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
        iVar9 = iVar9 + -1;
      } while (iVar9 != 0);
      piVar5 = (((_Vector_base<int,_std::allocator<int>_> *)&local_a0->field_0x0)->_M_impl).
               super__Vector_impl_data._M_start;
      piVar5[1] = 1;
      piVar5[2] = 3;
      local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (int *)0x0;
      local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (double *)0x0;
      local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (double *)0x0;
      local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (double *)0x0;
      ::std::vector<int,_std::allocator<int>_>::reserve(&local_98,(long)iVar8);
      ::std::vector<double,_std::allocator<double>_>::reserve(&local_68,(long)iVar8);
      local_b4 = 3;
      if (3 < (int)local_40) {
        do {
          (((_Vector_base<int,_std::allocator<int>_> *)&local_a0->field_0x0)->_M_impl).
          super__Vector_impl_data._M_start[local_b4] =
               (int)((ulong)((long)(indx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)(indx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data._M_start) >> 2);
          local_50 = getNode<(TasGrid::RuleLocal::erule)2>(local_b4);
          if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish !=
              local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start) {
            local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
          }
          if (local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start) {
            local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
          }
          iVar9 = local_b4 - (local_b4 + 1 >> 0x1f);
          iVar8 = local_b4;
          while (local_a4 = iVar9 + 1 >> 1, 4 < iVar8) {
            if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              ::std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&local_98,
                         (iterator)
                         local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,&local_a4);
            }
            else {
              *local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish = local_a4;
              local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish = local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish + 1;
            }
            local_b0 = (double *)evalRaw<(TasGrid::RuleLocal::erule)2>(max_order,local_a4,local_50);
            if (local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                        ((vector<double,_std::allocator<double>_> *)&local_68,
                         (iterator)
                         local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish,(double *)&local_b0);
            }
            else {
              *local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish = (double)local_b0;
              local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            iVar9 = local_a4 - (local_a4 + 1 >> 0x1f);
            iVar8 = local_a4;
          }
          local_b0 = (double *)((ulong)local_b0 & 0xffffffff00000000);
          iVar3._M_current =
               (indx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
               ._M_finish;
          if (iVar3._M_current ==
              (indx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_end_of_storage) {
            ::std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      ((vector<int,_std::allocator<int>_> *)indx,iVar3,(int *)&local_b0);
          }
          else {
            *iVar3._M_current = 0;
            (indx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish = iVar3._M_current + 1;
          }
          local_b0._0_4_ = 1;
          iVar3._M_current =
               (indx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
               ._M_finish;
          if (iVar3._M_current ==
              (indx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_end_of_storage) {
            ::std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      ((vector<int,_std::allocator<int>_> *)indx,iVar3,(int *)&local_b0);
          }
          else {
            *iVar3._M_current = 1;
            (indx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish = iVar3._M_current + 1;
          }
          local_b0 = (double *)CONCAT44(local_b0._4_4_,2);
          iVar3._M_current =
               (indx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
               ._M_finish;
          if (iVar3._M_current ==
              (indx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_end_of_storage) {
            ::std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      ((vector<int,_std::allocator<int>_> *)indx,iVar3,(int *)&local_b0);
          }
          else {
            *iVar3._M_current = 2;
            (indx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish = iVar3._M_current + 1;
          }
          local_b0 = (double *)
                     local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          local_48 = (double *)
                     local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
          ::std::vector<int,std::allocator<int>>::
          _M_range_insert<std::reverse_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>>
                    ((vector<int,std::allocator<int>> *)indx,
                     (indx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish,&local_b0,&local_48);
          iVar3._M_current =
               (indx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
               ._M_finish;
          if (iVar3._M_current ==
              (indx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_end_of_storage) {
            ::std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)indx,iVar3,&local_b4);
          }
          else {
            *iVar3._M_current = local_b4;
            (indx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish = iVar3._M_current + 1;
          }
          local_b0 = (double *)0x3ff0000000000000;
          iVar4._M_current =
               (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      (vals,iVar4,(double *)&local_b0);
          }
          else {
            *iVar4._M_current = 1.0;
            (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar4._M_current + 1;
          }
          local_38 = local_50 * 0.5;
          local_b0 = (double *)((local_50 + -1.0) * local_38);
          iVar4._M_current =
               (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      (vals,iVar4,(double *)&local_b0);
          }
          else {
            *iVar4._M_current = (double)local_b0;
            (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar4._M_current + 1;
          }
          local_b0 = (double *)(local_38 * (local_50 + 1.0));
          iVar4._M_current =
               (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      (vals,iVar4,(double *)&local_b0);
          }
          else {
            *iVar4._M_current = (double)local_b0;
            (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar4._M_current + 1;
          }
          local_b0 = local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          local_48 = local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
          ::std::vector<double,std::allocator<double>>::
          _M_range_insert<std::reverse_iterator<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>>
                    ((vector<double,std::allocator<double>> *)vals,
                     (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_finish,&local_b0,&local_48);
          local_b0 = (double *)0x3ff0000000000000;
          iVar4._M_current =
               (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      (vals,iVar4,(double *)&local_b0);
          }
          else {
            *iVar4._M_current = 1.0;
            (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar4._M_current + 1;
          }
          local_b4 = local_b4 + 1;
        } while (local_b4 < (int)local_40);
      }
      (((_Vector_base<int,_std::allocator<int>_> *)&local_a0->field_0x0)->_M_impl).
      super__Vector_impl_data._M_finish[-1] =
           (int)((ulong)((long)(indx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(indx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start) >> 2);
      if (local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (double *)0x0) {
        operator_delete(local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if ((double *)
          local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start == (double *)0x0) {
        return;
      }
      operator_delete(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
      return;
    }
    local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)((ulong)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start & 0xffffffff00000000);
    ::std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
              ((vector<int,std::allocator<int>> *)indx,&local_98);
    local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)&DAT_3ff0000000000000;
    ::std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
              ((vector<double,std::allocator<double>> *)vals,&local_98,
               &local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish);
    ppiVar7 = &local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
  }
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x100000000;
  ::std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>(local_a0,&local_98,ppiVar7);
  return;
}

Assistant:

void van_matrix(int max_order, int num_rows, std::vector<int> &pntr, std::vector<int> &indx, std::vector<double> &vals) {
        int max_level = getLevel<effrule>(num_rows);

        if (effrule == erule::pwc) {
            switch(num_rows) {
                case 0:
                    indx = {0,};
                    vals = {1.0,};
                    pntr = {0, 1};
                    break;
                case 1:
                    indx = {0, 0, 1};
                    vals = {1.0, 1.0, 1.0};
                    pntr = {0, 1, 3};
                    break;
                case 2:
                    indx = {0, 0, 1, 0, 2};
                    vals = {1.0, 1.0, 1.0, 1.0, 1.0};
                    pntr = {0, 1, 3, 5};
                    break;
                default:
                    indx.clear();
                    indx.reserve(num_rows * max_level);
                    vals.clear();
                    vals.reserve(num_rows * max_level);
                    pntr = std::vector<int>(num_rows + 1, 0);
                    for(auto i : std::array<int, 5>{0, 0, 1, 0, 2})
                        indx.push_back(i);
                    for(size_t i=0; i<5; i++)
                        vals.push_back(1.0);
                    pntr[1] = 1;
                    pntr[2] = 3;
                    {
                        std::vector<int> ancestors;
                        ancestors.reserve(max_level);
                        for(int r=3; r<num_rows; r++) {
                            pntr[r] = static_cast<int>(indx.size());
                            ancestors.clear();
                            int kid = r;
                            int dad = kid / 3;
                            while(dad != 0) {
                                if (dad % 2 == 0) {
                                    if (kid != 3 * dad)
                                        ancestors.push_back(dad);
                                } else {
                                    if (kid != 3 * dad + 2)
                                        ancestors.push_back(dad);
                                }
                                kid = dad;
                                dad = kid / 3;
                            }
                            indx.push_back(0);
                            indx.insert(indx.end(), ancestors.rbegin(), ancestors.rend());
                            indx.push_back(r);
                            for(size_t i=0; i<ancestors.size() + 2; i++)
                                vals.push_back(1.0);
                        }
                        pntr.back() = static_cast<int>(indx.size());
                    }
                    break;
            };
        } else if (effrule == erule::localp) {
            switch(num_rows) {
                case 0:
                    indx = {0,};
                    vals = {1.0,};
                    pntr = {0, 1};
                    break;
                default:
                    indx.clear();
                    indx.reserve(num_rows * max_level);
                    vals.clear();
                    vals.reserve(num_rows * max_level);
                    pntr = std::vector<int>(num_rows + 1, 0);
                    indx.push_back(0);
                    vals.push_back(1.0);
                    {
                        std::vector<int> ancestors;
                        std::vector<double> ancestors_vals;
                        ancestors.reserve(max_level);
                        ancestors_vals.reserve(max_level);
                        for(int r=1; r<num_rows; r++) {
                            double x = getNode<effrule>(r);
                            pntr[r] = static_cast<int>(indx.size());
                            ancestors.clear();
                            ancestors_vals.clear();
                            int kid = r;
                            int dad = (kid + 1) / 2;
                            if (kid < 4) dad--;
                            while(dad != 0) {
                                ancestors.push_back(dad);
                                ancestors_vals.push_back( evalRaw<effrule>(max_order, dad, x) );
                                kid = dad;
                                dad = (kid + 1) / 2;
                                if (kid < 4) dad--;
                            }
                            indx.push_back(0);
                            indx.insert(indx.end(), ancestors.rbegin(), ancestors.rend());
                            indx.push_back(r);
                            vals.push_back(1.0);
                            vals.insert(vals.end(), ancestors_vals.rbegin(), ancestors_vals.rend());
                            vals.push_back(1.0);
                        }
                        pntr.back() = static_cast<int>(indx.size());
                    }
                    break;
            };
        } else if (effrule == erule::semilocalp) {
            switch(num_rows) {
                case 0:
                    indx = {0,};
                    vals = {1.0,};
                    pntr = {0, 1};
                    break;
                case 1:
                    indx = {0, 0, 1};
                    vals = {1.0, 1.0, 1.0};
                    pntr = {0, 1, 3};
                    break;
                case 2:
                    indx = {0, 0, 1, 0, 2};
                    vals = {1.0, 1.0, 1.0, 1.0, 1.0};
                    pntr = {0, 1, 3, 5};
                    break;
                default:
                    indx.clear();
                    indx.reserve(num_rows * max_level);
                    vals.clear();
                    vals.reserve(num_rows * max_level);
                    pntr = std::vector<int>(num_rows + 1, 0);
                    for(auto i : std::array<int, 5>{0, 0, 1, 0, 2})
                        indx.push_back(i);
                    for(int i=0; i<5; i++)
                        vals.push_back(1.0);
                    pntr[1] = 1;
                    pntr[2] = 3;
                    {
                        std::vector<int> ancestors;
                        std::vector<double> ancestors_vals;
                        ancestors.reserve(max_level);
                        ancestors_vals.reserve(max_level);
                        for(int r=3; r<num_rows; r++) {
                            pntr[r] = static_cast<int>(indx.size());
                            double x = getNode<effrule>(r);
                            ancestors.clear();
                            ancestors_vals.clear();
                            int kid = r;
                            int dad = (kid + 1) / 2;
                            while(dad > 2) {
                                ancestors.push_back(dad);
                                ancestors_vals.push_back( evalRaw<effrule>(max_order, dad, x) );
                                kid = dad;
                                dad = (kid + 1) / 2;
                            }
                            indx.push_back(0);
                            indx.push_back(1);
                            indx.push_back(2);
                            indx.insert(indx.end(), ancestors.rbegin(), ancestors.rend());
                            indx.push_back(r);
                            vals.push_back(1.0);
                            vals.push_back( evalRaw<effrule>(max_order, 1, x) );
                            vals.push_back( evalRaw<effrule>(max_order, 2, x) );
                            vals.insert(vals.end(), ancestors_vals.rbegin(), ancestors_vals.rend());
                            vals.push_back(1.0);
                        }
                        pntr.back() = static_cast<int>(indx.size());
                    }
                    break;
            };
        } else if (effrule == erule::localp0) {
            switch(num_rows) {
                case 0:
                    indx = {0,};
                    vals = {1.0,};
                    pntr = {0, 1};
                    break;
                default:
                    indx.clear();
                    indx.reserve(num_rows * max_level);
                    vals.clear();
                    vals.reserve(num_rows * max_level);
                    pntr = std::vector<int>(num_rows + 1, 0);
                    indx.push_back(0);
                    vals.push_back(1.0);
                    {
                        std::vector<int> ancestors;
                        std::vector<double> ancestors_vals;
                        ancestors.reserve(max_level);
                        ancestors_vals.reserve(max_level);
                        for(int r=1; r<num_rows; r++) {
                            double x = getNode<effrule>(r);
                            pntr[r] = static_cast<int>(indx.size());
                            ancestors.clear();
                            ancestors_vals.clear();
                            int kid = r;
                            int dad = (kid - 1) / 2;
                            while(dad != 0) {
                                ancestors.push_back(dad);
                                ancestors_vals.push_back( evalRaw<effrule>(max_order, dad, x) );
                                kid = dad;
                                dad = (kid - 1) / 2;
                            }
                            indx.push_back(0);
                            indx.insert(indx.end(), ancestors.rbegin(), ancestors.rend());
                            indx.push_back(r);
                            vals.push_back( evalRaw<effrule>(max_order, 0, x) );
                            vals.insert(vals.end(), ancestors_vals.rbegin(), ancestors_vals.rend());
                            vals.push_back(1.0);
                        }
                        pntr.back() = static_cast<int>(indx.size());
                    }
                    break;
            };
        } else { // if (effrule == erule::localpb) {
            switch(num_rows) {
                case 0:
                    indx = {0,};
                    vals = {1.0,};
                    pntr = {0, 1};
                    break;
                case 1:
                    indx = {0, 1};
                    vals = {1.0, 1.0};
                    pntr = {0, 1, 2};
                    break;
                default:
                    indx.clear();
                    indx.reserve(num_rows * max_level);
                    vals.clear();
                    vals.reserve(num_rows * max_level);
                    pntr = std::vector<int>(num_rows + 1, 0);
                    indx.push_back(0);
                    indx.push_back(1);
                    vals.push_back(1.0);
                    vals.push_back(1.0);
                    pntr[1] = 1;
                    {
                        std::vector<int> ancestors;
                        std::vector<double> ancestors_vals;
                        ancestors.reserve(max_level);
                        ancestors_vals.reserve(max_level);
                        for(int r=2; r<num_rows; r++) {
                            pntr[r] = static_cast<int>(indx.size());
                            double x = getNode<effrule>(r);
                            ancestors.clear();
                            ancestors_vals.clear();
                            int kid = r;
                            int dad = (kid + 1) / 2;
                            while(dad > 1) {
                                ancestors.push_back(dad);
                                ancestors_vals.push_back( evalRaw<effrule>(max_order, dad, x) );
                                kid = dad;
                                dad = (kid + 1) / 2;
                            }
                            indx.push_back(0);
                            indx.push_back(1);
                            indx.insert(indx.end(), ancestors.rbegin(), ancestors.rend());
                            indx.push_back(r);
                            vals.push_back( evalRaw<effrule>(max_order, 0, x) );
                            vals.push_back( evalRaw<effrule>(max_order, 1, x) );
                            vals.insert(vals.end(), ancestors_vals.rbegin(), ancestors_vals.rend());
                            vals.push_back(1.0);
                        }
                        pntr.back() = static_cast<int>(indx.size());
                    }
                    break;
            };
        }
    }